

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3FilterMethod(sqlite3_vtab_cursor *pCursor,int idxNum,char *idxStr,int nVal,
                    sqlite3_value **apVal)

{
  char **pzErr;
  Fts3TokenAndCost *pFVar1;
  undefined8 *puVar2;
  sqlite3_vtab *psVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  sqlite3_vtab *psVar11;
  char *pcVar12;
  i64 iVar13;
  ulong uVar14;
  void *pvVar15;
  Fts3Expr *pFVar16;
  Fts3Expr *pFVar17;
  Fts3Phrase *pFVar18;
  ulong uVar19;
  Fts3Expr *pFVar20;
  Mem *pMem;
  long lVar21;
  Fts3Expr **__dest;
  sqlite3_vtab_cursor *pp;
  byte bVar22;
  int iVar23;
  sqlite3_value *pVal;
  ulong uVar24;
  Fts3Expr *pFVar25;
  long lVar26;
  size_t sVar27;
  long lVar28;
  ulong __n;
  undefined1 uVar29;
  bool bVar30;
  bool bVar31;
  int nByte;
  int iEnd;
  int iBegin;
  sqlite3_tokenizer_cursor *pCursor_1;
  char *zByte;
  uint local_134;
  int local_130;
  uint local_12c;
  Fts3Expr *local_128;
  ulong local_120;
  uint local_118;
  uint local_114;
  char local_10d;
  uint local_10c;
  Fts3Cursor *local_108;
  uint local_fc;
  Fts3Expr *local_f8;
  ulong local_f0;
  Fts3Expr *local_e8;
  void *local_e0;
  Fts3Phrase *local_d8;
  int local_d0;
  int local_cc;
  Fts3Expr *local_c8;
  Fts3Expr *local_c0;
  long local_b8;
  int local_ac;
  long local_a8;
  Fts3Expr *local_a0;
  Fts3Phrase *local_98;
  int local_8c;
  sqlite3_value *local_88;
  sqlite3_vtab *local_80;
  Fts3TokenAndCost *local_78;
  sqlite3_vtab_cursor *local_70;
  Fts3Phrase *local_68;
  sqlite3_module *local_60;
  sqlite3_value *local_58;
  sqlite3_value *local_50;
  char *local_48;
  ulong local_40;
  long local_38;
  
  local_fc = idxNum & 0xffff;
  if (local_fc == 0) {
    local_88 = (sqlite3_value *)0x0;
  }
  else {
    local_88 = *apVal;
  }
  uVar5 = (uint)(local_fc != 0);
  if (((uint)idxNum >> 0x10 & 1) == 0) {
    pMem = (Mem *)0x0;
  }
  else {
    uVar14 = (ulong)uVar5;
    uVar5 = uVar5 + 1;
    pMem = apVal[uVar14];
  }
  if (((uint)idxNum >> 0x11 & 1) == 0) {
    local_58 = (sqlite3_value *)0x0;
  }
  else {
    uVar14 = (ulong)uVar5;
    uVar5 = uVar5 + 1;
    local_58 = apVal[uVar14];
  }
  if (((uint)idxNum >> 0x12 & 1) == 0) {
    pVal = (sqlite3_value *)0x0;
  }
  else {
    pVal = apVal[uVar5];
  }
  psVar3 = pCursor->pVtab;
  local_118 = idxNum;
  fts3ClearCursor((Fts3Cursor *)pCursor);
  psVar11 = (sqlite3_vtab *)fts3DocidRange(local_58,-0x8000000000000000);
  pCursor[0xc].pVtab = psVar11;
  local_50 = pVal;
  psVar11 = (sqlite3_vtab *)fts3DocidRange(pVal,0x7fffffffffffffff);
  uVar5 = local_118;
  pCursor[0xd].pVtab = psVar11;
  if (idxStr == (char *)0x0) {
    uVar29 = *(undefined1 *)((long)&psVar3[0x12].zErrMsg + 7);
  }
  else {
    uVar29 = *idxStr == 'D';
  }
  *(undefined1 *)((long)&pCursor[9].pVtab + 4) = uVar29;
  *(short *)&pCursor[1].pVtab = (short)local_118;
  uVar10 = 0;
  local_80 = psVar3;
  if (local_fc < 2) goto LAB_001b98ba;
  local_68 = (Fts3Phrase *)sqlite3ValueText(local_88,'\x01');
  if ((local_68 != (Fts3Phrase *)0x0) ||
     (uVar10._0_2_ = local_88->flags, uVar10._2_1_ = local_88->enc,
     uVar10._3_1_ = local_88->eSubtype, (0xaaaaaaaaU >> (uVar10 & 0x1f) & 1) != 0)) {
    *(undefined4 *)&pCursor[4].pVtab = 0;
    if (pMem != (Mem *)0x0) {
      iVar13 = sqlite3VdbeIntValue(pMem);
      *(int *)&pCursor[4].pVtab = (int)iVar13;
    }
    pFVar18 = local_68;
    pp = pCursor + 3;
    local_108 = (Fts3Cursor *)pCursor;
    if (local_68 != (Fts3Phrase *)0x0) {
      local_fc = local_fc - 2;
      lVar28 = *(long *)&local_80[2].nRef;
      local_60 = local_80[3].pModule;
      local_8c = *(int *)&pCursor[4].pVtab;
      uVar5 = *(uint *)&local_80[2].pModule;
      local_10d = *(char *)((long)&local_80[0x12].zErrMsg + 4);
      local_70 = pp;
      uVar14 = strlen((char *)local_68);
      local_38 = (ulong)uVar5 - 1;
      local_10c = 1;
      local_f8 = (Fts3Expr *)0x0;
      uVar10 = 0;
      local_c0 = (Fts3Expr *)0x0;
      local_e8 = (Fts3Expr *)0x0;
      local_a8 = lVar28;
      local_98 = pFVar18;
      local_40 = (ulong)uVar5;
LAB_001b8a0e:
      uVar5 = (uint)uVar14;
      if (uVar10 == 0) {
        pFVar18 = local_98;
        if (0 < (int)uVar5) {
          uVar19 = uVar14 & 0xffffffff;
          do {
            uVar5 = (uint)uVar19;
            bVar22 = *(byte *)&(pFVar18->doclist).aAll;
            if ((4 < bVar22 - 9) && (bVar22 != 0x20)) goto LAB_001b8a5a;
            uVar19 = (ulong)(uVar5 - 1);
            pFVar18 = (Fts3Phrase *)((long)&(pFVar18->doclist).aAll + 1);
          } while (1 < (int)uVar5);
          uVar5 = 0;
          pFVar18 = (Fts3Phrase *)((long)local_98->aToken + ((uVar14 & 0xffffffff) - 0x58));
        }
LAB_001b8a5a:
        bVar30 = true;
        local_f0 = uVar14;
        if (uVar5 != 0) {
          pFVar17 = (Fts3Expr *)(ulong)uVar5;
          local_b8 = (long)pFVar18 - (long)local_98;
          local_a0 = (Fts3Expr *)0x0;
          uVar19 = 0;
          lVar26 = 0;
          local_128 = pFVar17;
          local_d8 = pFVar18;
          do {
            lVar21 = lVar26 * 0x10;
            iVar9 = 6;
            if ((&DAT_0020d9e9)[lVar21] == '\0') {
              __n = (ulong)(byte)(&DAT_0020d9e8)[lVar21];
              iVar9 = 0;
              if (((int)(uint)(byte)(&DAT_0020d9e8)[lVar21] <= (int)pFVar17) &&
                 (local_120 = uVar19,
                 iVar6 = bcmp(pFVar18,(void *)(&getNextNode_aKeyword)[lVar26 * 2],__n),
                 uVar19 = local_120, pFVar17 = local_128, pFVar18 = local_d8, iVar6 == 0)) {
                iVar6 = 10;
                if (((byte)(&DAT_0020d9ea)[lVar21] == 1) &&
                   ((*(char *)((long)&(local_d8->doclist).aAll + 4) == '/' &&
                    (cVar4 = *(char *)((long)&(local_d8->doclist).aAll + 5),
                    (byte)(cVar4 - 0x30U) < 10)))) {
                  iVar6 = 0;
                  lVar28 = 6;
                  do {
                    iVar6 = (uint)(byte)(cVar4 - 0x30) + iVar6 * 10;
                    cVar4 = *(char *)((long)local_d8->aToken + lVar28 + -0x58);
                    lVar28 = lVar28 + 1;
                  } while ((byte)(cVar4 - 0x30U) < 10);
                  __n = (ulong)((int)lVar28 - 1);
                }
                bVar22 = *(byte *)((long)local_d8->aToken + (__n - 0x58));
                local_e0 = (void *)(ulong)bVar22;
                uVar24 = 0xffffc1ffL >> (bVar22 & 0x3f);
                if (((uVar24 & 1) == 0 && bVar22 < 0x21) ||
                   ((bVar22 < 0x2a && ((0x30400000001U >> ((ulong)local_e0 & 0x3f) & 1) != 0)))) {
                  local_114 = (uint)(byte)(&DAT_0020d9ea)[lVar21];
                  pFVar17 = (Fts3Expr *)fts3MallocZero(0x40);
                  if (pFVar17 == (Fts3Expr *)0x0) {
                    local_114 = 7;
                    uVar19 = local_120;
                  }
                  else {
                    pFVar17->eType = local_114;
                    pFVar17->nNear = iVar6;
                    local_114 = 0;
                    uVar19 = (ulong)(uint)((int)__n + (int)local_b8);
                    local_a0 = pFVar17;
                  }
                }
                uVar14 = local_f0;
                pFVar18 = local_d8;
                pFVar17 = local_128;
                lVar28 = local_a8;
                if ((uVar24 & 1) == 0 && bVar22 < 0x21) {
                  iVar9 = 1;
                }
                else if ((bVar22 < 0x2a) && ((0x30400000001U >> ((ulong)local_e0 & 0x3f) & 1) != 0))
                {
                  iVar9 = 1;
                }
              }
            }
            pCursor = &local_108->base;
            pFVar16 = local_a0;
            if ((iVar9 != 6) && (uVar10 = local_114, iVar9 != 0)) goto LAB_001b933e;
            lVar26 = lVar26 + 1;
          } while (lVar26 != 4);
          if (*(char *)&(pFVar18->doclist).aAll == '\"') {
            uVar10 = 1;
            pFVar25 = (Fts3Expr *)0x1;
            if (1 < (int)pFVar17) {
              pFVar25 = (Fts3Expr *)0x1;
              do {
                if (*(char *)((long)&pFVar25->pPhrase + (long)(pFVar18->aToken + -3)) == '\"')
                goto LAB_001b8c8d;
                pFVar25 = (Fts3Expr *)((long)&pFVar25->eType + 1);
              } while (pFVar17 != pFVar25);
              pFVar25 = (Fts3Expr *)((ulong)pFVar17 & 0xffffffff);
            }
LAB_001b8c8d:
            iVar9 = (int)pFVar25;
            uVar19 = (ulong)((int)local_b8 + iVar9 + 1);
            if (iVar9 == (int)pFVar17) goto LAB_001b933e;
            pcVar12 = (char *)((long)&(pFVar18->doclist).aAll + 1);
            local_b8 = *(long *)&local_60->iVersion;
            local_c8 = (Fts3Expr *)0x0;
            local_120 = uVar19;
            uVar10 = sqlite3Fts3OpenTokenizer
                               ((sqlite3_tokenizer *)local_60,local_8c,pcVar12,iVar9 + -1,
                                (sqlite3_tokenizer_cursor **)&local_c8);
            if (uVar10 == 0) {
              iVar6 = 1;
              lVar28 = 0xc0;
              local_d0 = 0;
              local_cc = 0;
              local_e0 = (void *)0x0;
              local_128 = (Fts3Expr *)0x0;
              local_48 = pcVar12;
              do {
                local_134 = 0;
                local_12c = 0;
                local_130 = 0;
                local_ac = 0;
                uVar10 = (**(code **)(local_b8 + 0x28))
                                   ((sqlite3_tokenizer_cursor *)local_c8,(char **)&local_78,
                                    (int *)&local_134,(int *)&local_12c,&local_130,&local_ac);
                bVar31 = true;
                if (uVar10 == 0) {
                  local_128 = (Fts3Expr *)fts3ReallocOrFree(local_128,lVar28);
                  iVar23 = 5;
                  if (local_128 == (Fts3Expr *)0x0) {
                    bVar31 = false;
                  }
                  else {
                    lVar26 = (long)local_cc;
                    local_114 = uVar10;
                    local_e0 = fts3ReallocOrFree(local_e0,(int)local_134 + lVar26);
                    pFVar17 = local_128;
                    if (local_e0 == (void *)0x0) {
                      local_e0 = (void *)0x0;
                      bVar31 = false;
                      uVar10 = local_114;
                    }
                    else {
                      puVar2 = (undefined8 *)((long)local_128 + lVar28 + -0x18);
                      *puVar2 = 0;
                      puVar2[1] = 0;
                      puVar2 = (undefined8 *)((long)local_128 + lVar28 + -0x28);
                      *puVar2 = 0;
                      puVar2[1] = 0;
                      *(undefined8 *)((long)local_128 + lVar28 + -8) = 0;
                      memcpy((void *)(lVar26 + (long)local_e0),local_78,(long)(int)local_134);
                      uVar5 = 0;
                      *(uint *)((long)pFVar17 + lVar28 + -0x20) = local_134;
                      if (local_130 < iVar9 + -1) {
                        uVar5 = (uint)(local_48[local_130] == '*');
                      }
                      *(uint *)((long)pFVar17 + lVar28 + -0x1c) = uVar5;
                      iVar23 = 0;
                      uVar5 = 0;
                      if (0 < (long)(int)local_12c) {
                        uVar5 = (uint)(*(char *)((long)local_d8->aToken +
                                                (long)(int)local_12c + -0x58) == '^');
                      }
                      local_cc = local_cc + local_134;
                      *(uint *)((long)local_128 + lVar28 + -0x18) = uVar5;
                      local_d0 = iVar6;
                      uVar10 = local_114;
                    }
                  }
                }
                else {
                  iVar23 = 0;
                }
                if (!bVar31) goto LAB_001b9242;
                iVar6 = iVar6 + 1;
                lVar28 = lVar28 + 0x28;
              } while (uVar10 == 0);
              (**(code **)(local_b8 + 0x20))((sqlite3_tokenizer_cursor *)local_c8);
              local_c8 = (Fts3Expr *)0x0;
              iVar23 = 0;
LAB_001b9242:
              uVar14 = local_f0;
              lVar28 = local_a8;
              pCursor = &local_108->base;
              if (iVar23 != 5) {
                pvVar15 = local_e0;
                uVar19 = local_120;
                pFVar16 = local_a0;
                iVar9 = local_d0;
                if (iVar23 != 0) goto LAB_001b933e;
                goto LAB_001b8e44;
              }
LAB_001b92c4:
              pFVar17 = local_128;
              if (local_c8 != (Fts3Expr *)0x0) {
                (**(code **)(local_b8 + 0x20))((sqlite3_tokenizer_cursor *)local_c8);
              }
              sqlite3_free(local_e0);
              sqlite3_free(pFVar17);
              uVar19 = local_120;
              pFVar16 = (Fts3Expr *)0x0;
              uVar10 = 7;
            }
            else {
              local_128 = (Fts3Expr *)0x0;
              local_cc = 0;
              pvVar15 = (void *)0x0;
              iVar9 = 0;
LAB_001b8e44:
              pCursor = &local_108->base;
              if (uVar10 == 0x65) {
                sVar27 = (size_t)local_cc;
                local_e0 = pvVar15;
                local_d0 = iVar9;
                pFVar17 = (Fts3Expr *)
                          fts3ReallocOrFree(local_128,sVar27 + (long)iVar9 * 0x28 + 0xc0);
                local_128 = pFVar17;
                if (pFVar17 == (Fts3Expr *)0x0) {
                  iVar9 = 5;
                  uVar10 = 0x65;
                }
                else {
                  local_d8 = (Fts3Phrase *)(pFVar17 + 1);
                  memset(pFVar17,0,0x98);
                  pvVar15 = local_e0;
                  pFVar17->eType = 5;
                  pFVar17->pPhrase = local_d8;
                  *(uint *)((long)&pFVar17[2].pLeft + 4) = local_fc;
                  *(int *)&pFVar17[2].pLeft = local_d0;
                  __dest = &pFVar17[2].pRight + (long)iVar9 * 5;
                  if (local_e0 != (void *)0x0) {
                    memcpy(__dest,local_e0,sVar27);
                    sqlite3_free(pvVar15);
                  }
                  pFVar18 = local_128->pPhrase;
                  iVar9 = pFVar18->nToken;
                  uVar10 = 0;
                  if (0 < (long)iVar9) {
                    lVar26 = 0;
                    do {
                      *(Fts3Expr ***)((long)&pFVar18->aToken[0].z + lVar26) = __dest;
                      __dest = (Fts3Expr **)
                               ((long)__dest + (long)*(int *)((long)&pFVar18->aToken[0].n + lVar26))
                      ;
                      lVar26 = lVar26 + 0x28;
                    } while ((long)iVar9 * 0x28 != lVar26);
                  }
                  iVar9 = 0;
                }
                if (iVar9 == 5) goto LAB_001b92c4;
                uVar19 = local_120;
                pFVar16 = local_a0;
                if (iVar9 != 0) goto LAB_001b933e;
              }
              uVar19 = local_120;
              pFVar16 = local_128;
            }
            goto LAB_001b933e;
          }
          uVar19 = local_120 >> 0x20;
          local_120 = uVar19 << 0x20;
          uVar5 = local_fc;
          if (0 < (int)local_40) {
            local_120 = uVar19 << 0x20;
            lVar26 = 0;
            do {
              pcVar12 = *(char **)(lVar28 + lVar26 * 8);
              sVar27 = strlen(pcVar12);
              iVar9 = (int)sVar27;
              if (((iVar9 < (int)local_128) &&
                  (*(char *)((long)local_d8->aToken + (long)iVar9 + -0x58) == ':')) &&
                 (iVar6 = sqlite3_strnicmp(pcVar12,(char *)local_d8,iVar9), iVar6 == 0)) {
                local_120 = CONCAT44(local_120._4_4_,(int)local_b8 + iVar9 + 1);
                bVar30 = true;
                uVar5 = (uint)lVar26;
              }
              else {
                bVar30 = false;
              }
            } while ((!bVar30) && (bVar30 = local_38 != lVar26, lVar26 = lVar26 + 1, bVar30));
          }
          pcVar12 = (char *)((long)local_98->aToken + (long)(int)local_120 + -0x58);
          lVar28 = *(long *)&local_60->iVersion;
          uVar8 = (int)uVar14 - (int)local_120;
          uVar19 = 0;
          if (uVar8 != 0 && (int)local_120 <= (int)uVar14) {
            uVar19 = 0;
            do {
              if (pcVar12[uVar19] == '\"') goto LAB_001b8d92;
              uVar19 = uVar19 + 1;
            } while (uVar8 != uVar19);
            uVar19 = (ulong)uVar8;
          }
LAB_001b8d92:
          iVar9 = (int)uVar19;
          uVar10 = sqlite3Fts3OpenTokenizer
                             ((sqlite3_tokenizer *)local_60,local_8c,pcVar12,iVar9,
                              (sqlite3_tokenizer_cursor **)&local_c8);
          if (uVar10 == 0) {
            local_134 = 0;
            local_12c = 0;
            local_130 = 0;
            local_ac = 0;
            local_128 = local_c8;
            uVar7 = (**(code **)(lVar28 + 0x28))
                              ((sqlite3_tokenizer_cursor *)local_c8,(char **)&local_78,
                               (int *)&local_134,(int *)&local_12c,&local_130,&local_ac);
            if (uVar7 == 0) {
              pFVar16 = (Fts3Expr *)fts3MallocZero((long)(int)local_134 + 0xc0);
              if (pFVar16 != (Fts3Expr *)0x0) {
                pFVar16->eType = 5;
                pFVar16->pPhrase = (Fts3Phrase *)(pFVar16 + 1);
                *(undefined4 *)&pFVar16[2].pLeft = 1;
                *(uint *)((long)&pFVar16[2].pLeft + 4) = uVar5;
                *(uint *)&pFVar16[2].pPhrase = local_134;
                pFVar16[2].pRight = pFVar16 + 3;
                memcpy(pFVar16 + 3,local_78,(long)(int)local_134);
                if ((local_130 < (int)uVar8) && (pcVar12[local_130] == '*')) {
                  *(undefined4 *)((long)&pFVar16[2].pPhrase + 4) = 1;
                  local_130 = local_130 + 1;
                }
                bVar30 = false;
                do {
                  if (((int)local_12c < 1) || (bVar31 = true, pcVar12[(ulong)local_12c - 1] != '-'))
                  {
                    if ((local_10d == '\0') ||
                       (((int)local_12c < 1 || (pcVar12[(ulong)local_12c - 1] != '^'))))
                    goto LAB_001b9274;
                    pFVar16->pPhrase->aToken[0].bFirst = 1;
                    bVar31 = bVar30;
                  }
                  bVar30 = bVar31;
                  local_12c = local_12c - 1;
                } while( true );
              }
              uVar10 = 7;
              bVar30 = true;
              iVar9 = local_130;
            }
            else {
              uVar10 = uVar7;
              if (uVar7 == 0x65) {
                uVar10 = 0;
              }
              if (iVar9 == 0) {
                uVar10 = uVar7;
              }
              bVar30 = true;
              pFVar16 = (Fts3Expr *)0x0;
            }
            goto LAB_001b931a;
          }
          bVar30 = true;
          pFVar16 = (Fts3Expr *)0x0;
          uVar14 = local_f0;
          goto LAB_001b932c;
        }
        uVar19 = 0;
        pFVar16 = (Fts3Expr *)0x0;
        uVar10 = 0x65;
        goto LAB_001b933e;
      }
      uVar5 = 1;
      if (local_10c == 0) {
        uVar5 = uVar10;
      }
      if (local_f8 == (Fts3Expr *)0x0) {
        uVar5 = uVar10;
      }
      if (uVar10 == 0x65) {
        uVar10 = uVar5;
      }
      pFVar17 = local_f8;
      if (((uVar10 == 0x65) &&
          (uVar10 = (uint)(local_c0 != (Fts3Expr *)0x0), local_c0 != (Fts3Expr *)0x0)) &&
         (pFVar16 = local_c0, local_f8 != (Fts3Expr *)0x0)) {
        do {
          pFVar17 = pFVar16;
          pFVar16 = pFVar17->pLeft;
        } while (pFVar17->pLeft != (Fts3Expr *)0x0);
        pFVar17->pLeft = local_f8;
        local_f8->pParent = pFVar17;
        pFVar17 = local_c0;
        uVar10 = 0;
      }
      goto LAB_001b967f;
    }
    pFVar17 = (Fts3Expr *)0x0;
    uVar8 = 0;
    goto LAB_001b9694;
  }
  pcVar12 = (char *)0x7;
  uVar10 = 0;
  bVar30 = false;
LAB_001b98a9:
  if (!bVar30) {
    return (int)pcVar12;
  }
LAB_001b98ba:
  psVar3 = local_80;
  if ((short)uVar5 == 1) {
    uVar10 = fts3CursorSeekStmt((Fts3Cursor *)pCursor);
    if (uVar10 == 0) {
      uVar10 = sqlite3_bind_value(((Fts3Cursor *)pCursor)->pStmt,1,local_88);
    }
  }
  else if ((uVar5 & 0xffff) == 0) {
    local_58 = (sqlite3_value *)((ulong)local_58 | (ulong)local_50);
    if (local_58 == (sqlite3_value *)0x0) {
      pcVar12 = "DESC";
      if (((Fts3Cursor *)pCursor)->bDesc == '\0') {
        pcVar12 = "ASC";
      }
      pcVar12 = sqlite3_mprintf("SELECT %s ORDER BY rowid %s",local_80[0x12].pModule,pcVar12);
    }
    else {
      pcVar12 = sqlite3_mprintf("SELECT %s WHERE rowid BETWEEN %lld AND %lld ORDER BY rowid %s",
                                local_80[0x12].pModule,((Fts3Cursor *)pCursor)->iMinDocid,
                                ((Fts3Cursor *)pCursor)->iMaxDocid);
    }
    if (pcVar12 == (char *)0x0) {
      uVar10 = 7;
    }
    else {
      uVar10 = sqlite3LockAndPrepare
                         ((sqlite3 *)psVar3[1].pModule,pcVar12,-1,0x81,(Vdbe *)0x0,
                          &((Fts3Cursor *)pCursor)->pStmt,(char **)0x0);
      sqlite3_free(pcVar12);
    }
  }
  if (uVar10 == 0) {
    uVar10 = fts3NextMethod(pCursor);
  }
  return uVar10;
LAB_001b9274:
  bVar30 = !bVar30;
  uVar10 = 0;
  iVar9 = local_130;
LAB_001b931a:
  uVar14 = local_f0;
  (**(code **)(lVar28 + 0x20))((sqlite3_tokenizer_cursor *)local_128);
LAB_001b932c:
  uVar19 = (ulong)(uint)(iVar9 + (int)local_120);
  lVar28 = local_a8;
  pCursor = &local_108->base;
LAB_001b933e:
  if ((uVar10 == 0) && (pFVar16 != (Fts3Expr *)0x0)) {
    iVar9 = pFVar16->eType;
    if (iVar9 == 5) {
      bVar31 = true;
      if (bVar30) goto LAB_001b93c1;
      pFVar17 = (Fts3Expr *)fts3MallocZero(0x40);
      if (pFVar17 == (Fts3Expr *)0x0) {
        sqlite3Fts3ExprFree(pFVar16);
        bVar30 = true;
        uVar10 = 7;
      }
      else {
        pFVar17->eType = 2;
        pFVar17->pRight = pFVar16;
        pFVar16->pParent = pFVar17;
        uVar10 = 0;
        if (local_c0 != (Fts3Expr *)0x0) {
          pFVar17->pLeft = local_c0;
          local_c0->pParent = pFVar17;
        }
        bVar30 = false;
        pFVar16 = local_e8;
        local_c0 = pFVar17;
      }
      if (pFVar17 != (Fts3Expr *)0x0) goto LAB_001b9596;
    }
    else {
      bVar31 = pFVar16->pLeft != (Fts3Expr *)0x0;
LAB_001b93c1:
      if ((bVar31 == false) && (local_10c != 0)) {
        sqlite3Fts3ExprFree(pFVar16);
        bVar30 = true;
        uVar10 = 1;
        local_10c = 1;
      }
      else {
        bVar22 = bVar31 ^ 1;
        uVar10 = 0;
        local_120 = uVar19;
        if (local_10c == 0 && bVar22 == 0) {
          pFVar17 = (Fts3Expr *)fts3MallocZero(0x40);
          if (pFVar17 == (Fts3Expr *)0x0) {
            sqlite3Fts3ExprFree(pFVar16);
            bVar30 = true;
            uVar10 = 7;
          }
          else {
            pFVar17->eType = 3;
            do {
              pFVar25 = local_e8;
              local_e8 = pFVar25->pParent;
            } while (pFVar25->pParent != (Fts3Expr *)0x0);
            pFVar17->pLeft = pFVar25;
            pFVar25->pParent = pFVar17;
            uVar10 = 0;
            bVar30 = false;
            local_f8 = pFVar17;
            local_e8 = pFVar17;
          }
          if (pFVar17 == (Fts3Expr *)0x0) {
            local_10c = 0;
            uVar19 = local_120;
            uVar14 = local_f0;
            goto LAB_001b9592;
          }
        }
        if ((local_e8 == (Fts3Expr *)0x0) ||
           (((iVar9 != 1 || bVar31 != false || (local_e8->eType == 5)) &&
            ((iVar9 == 5 || bVar22 != 0 || (local_e8->eType != 1)))))) {
          pFVar17 = local_e8;
          pFVar25 = pFVar16;
          if (bVar31 == false) {
            do {
              pFVar20 = pFVar17;
              pFVar17 = pFVar20->pParent;
              if (pFVar17 == (Fts3Expr *)0x0) goto LAB_001b9571;
            } while ((pFVar17->eType == 1) ||
                    (pFVar16->eType != 1 && (pFVar17->eType == 4 || pFVar16->eType != 4)));
            pFVar17->pRight = pFVar16;
            pFVar16->pParent = pFVar17;
            pFVar25 = local_f8;
LAB_001b9571:
            pFVar16->pLeft = pFVar20;
            pFVar20->pParent = pFVar16;
          }
          else if (local_f8 != (Fts3Expr *)0x0) {
            local_e8->pRight = pFVar16;
            pFVar16->pParent = local_e8;
            pFVar25 = local_f8;
          }
          local_10c = (uint)bVar22;
          bVar30 = false;
          uVar19 = local_120;
          uVar14 = local_f0;
          local_f8 = pFVar25;
        }
        else {
          sqlite3Fts3ExprFree(pFVar16);
          bVar30 = true;
          uVar10 = 1;
          uVar19 = local_120;
          uVar14 = local_f0;
        }
      }
LAB_001b9592:
      if (!bVar30) {
LAB_001b9596:
        bVar30 = false;
        local_e8 = pFVar16;
      }
    }
    uVar8 = (uint)uVar19;
    pCursor = &local_108->base;
    if (bVar30) goto LAB_001b95b5;
  }
  uVar8 = (uint)uVar19;
  uVar14 = (ulong)((int)uVar14 - uVar8);
  local_98 = (Fts3Phrase *)((long)local_98->aToken + (long)(int)uVar8 + -0x58);
  bVar30 = false;
LAB_001b95b5:
  if (bVar30) goto code_r0x001b95bd;
  goto LAB_001b8a0e;
code_r0x001b95bd:
  pp = local_70;
  pFVar17 = local_f8;
  uVar5 = local_118;
  if (bVar30) {
LAB_001b967f:
    uVar8 = uVar10;
    pp = local_70;
    pFVar16 = local_c0;
    uVar5 = local_118;
    if (uVar8 != 0) {
      sqlite3Fts3ExprFree(pFVar17);
      sqlite3Fts3ExprFree(pFVar16);
      pFVar17 = (Fts3Expr *)0x0;
    }
LAB_001b9694:
    pp->pVtab = (sqlite3_vtab *)pFVar17;
  }
  if (uVar8 == 0) {
    if ((Fts3Expr *)pp->pVtab == (Fts3Expr *)0x0) {
      uVar8 = 0;
    }
    else {
      uVar8 = fts3ExprBalance((Fts3Expr **)pp,0xc);
      if (uVar8 == 0) {
        uVar8 = fts3ExprCheckDepth((Fts3Expr *)pp->pVtab,0xc);
      }
    }
  }
  if (uVar8 == 0) {
    pcVar12 = (char *)0x0;
  }
  else {
    pzErr = &local_80->zErrMsg;
    sqlite3Fts3ExprFree((Fts3Expr *)pp->pVtab);
    pp->pVtab = (sqlite3_vtab *)0x0;
    if (uVar8 == 1) {
      sqlite3Fts3ErrMsg(pzErr,"malformed MATCH expression: [%s]",local_68);
    }
    else {
      pcVar12 = (char *)(ulong)uVar8;
      if (uVar8 != 0x12) goto LAB_001b9736;
      sqlite3Fts3ErrMsg(pzErr,"FTS expression tree is too large (maximum depth %d)",0xc);
    }
    pcVar12 = (char *)0x1;
  }
LAB_001b9736:
  bVar30 = false;
  uVar10 = (uint)pcVar12;
  if (uVar10 == 0) {
    psVar3 = (((Fts3Cursor *)pCursor)->base).pVtab;
    local_134 = 0;
    local_12c = 0;
    local_130 = 0;
    fts3EvalAllocateReaders
              ((Fts3Cursor *)pCursor,((Fts3Cursor *)pCursor)->pExpr,(int *)&local_12c,&local_130,
               (int *)&local_134);
    uVar10 = local_12c;
    if ((1 < (int)local_12c && local_134 == 0) &&
       (*(char *)((long)&psVar3[0x12].zErrMsg + 4) != '\0')) {
      lVar28 = (long)local_130;
      iVar9 = sqlite3_initialize();
      if (iVar9 == 0) {
        pFVar17 = (Fts3Expr *)sqlite3Malloc(lVar28 * 0x10 + (ulong)uVar10 * 0x28);
      }
      else {
        pFVar17 = (Fts3Expr *)0x0;
      }
      if (pFVar17 == (Fts3Expr *)0x0) {
        local_134 = 7;
        uVar5 = local_118;
      }
      else {
        pFVar1 = (Fts3TokenAndCost *)((long)&pFVar17->eType + (long)(int)local_12c * 5 * 8);
        local_c8 = pFVar17;
        local_78 = pFVar1;
        fts3EvalTokenCosts((Fts3Cursor *)pCursor,(Fts3Expr *)0x0,((Fts3Cursor *)pCursor)->pExpr,
                           (Fts3TokenAndCost **)&local_c8,(Fts3Expr ***)&local_78,(int *)&local_134)
        ;
        local_12c = (int)((ulong)((long)local_c8 - (long)pFVar17) >> 3) * -0x33333333;
        local_130 = (int)((ulong)((long)local_78 - (long)pFVar1) >> 3);
        if (((local_134 == 0) &&
            (local_134 = fts3EvalSelectDeferred
                                   (local_108,(Fts3Expr *)0x0,(Fts3TokenAndCost *)pFVar17,local_12c)
            , local_134 == 0)) && (0 < local_130)) {
          lVar28 = 1;
          do {
            local_134 = 0;
            local_134 = fts3EvalSelectDeferred
                                  (local_108,*(Fts3Expr **)((long)pFVar1 + lVar28 * 8 + -8),
                                   (Fts3TokenAndCost *)pFVar17,local_12c);
            if (local_134 != 0) break;
            bVar30 = lVar28 < local_130;
            lVar28 = lVar28 + 1;
          } while (bVar30);
        }
        sqlite3_free(pFVar17);
        pCursor = &local_108->base;
        uVar5 = local_118;
      }
    }
    fts3EvalStartReaders((Fts3Cursor *)pCursor,((Fts3Cursor *)pCursor)->pExpr,(int *)&local_134);
    psVar3 = local_80;
    uVar10 = local_134;
    pcVar12 = (char *)(ulong)local_134;
    sqlite3_blob_close((sqlite3_blob *)local_80[0x13].zErrMsg);
    psVar3[0x13].zErrMsg = (char *)0x0;
    bVar30 = false;
    if (uVar10 == 0) {
      pcVar12 = ((Fts3Cursor *)pCursor)->aDoclist;
      ((Fts3Cursor *)pCursor)->pNextId = pcVar12;
      ((Fts3Cursor *)pCursor)->iPrevId = 0;
      bVar30 = true;
      uVar10 = 0;
    }
  }
  goto LAB_001b98a9;
}

Assistant:

static int fts3FilterMethod(
  sqlite3_vtab_cursor *pCursor,   /* The cursor used for this query */
  int idxNum,                     /* Strategy index */
  const char *idxStr,             /* Unused */
  int nVal,                       /* Number of elements in apVal */
  sqlite3_value **apVal           /* Arguments for the indexing scheme */
){
  int rc = SQLITE_OK;
  char *zSql;                     /* SQL statement used to access %_content */
  int eSearch;
  Fts3Table *p = (Fts3Table *)pCursor->pVtab;
  Fts3Cursor *pCsr = (Fts3Cursor *)pCursor;

  sqlite3_value *pCons = 0;       /* The MATCH or rowid constraint, if any */
  sqlite3_value *pLangid = 0;     /* The "langid = ?" constraint, if any */
  sqlite3_value *pDocidGe = 0;    /* The "docid >= ?" constraint, if any */
  sqlite3_value *pDocidLe = 0;    /* The "docid <= ?" constraint, if any */
  int iIdx;

  UNUSED_PARAMETER(idxStr);
  UNUSED_PARAMETER(nVal);

  eSearch = (idxNum & 0x0000FFFF);
  assert( eSearch>=0 && eSearch<=(FTS3_FULLTEXT_SEARCH+p->nColumn) );
  assert( p->pSegments==0 );

  /* Collect arguments into local variables */
  iIdx = 0;
  if( eSearch!=FTS3_FULLSCAN_SEARCH ) pCons = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_LANGID ) pLangid = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_DOCID_GE ) pDocidGe = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_DOCID_LE ) pDocidLe = apVal[iIdx++];
  assert( iIdx==nVal );

  /* In case the cursor has been used before, clear it now. */
  fts3ClearCursor(pCsr);

  /* Set the lower and upper bounds on docids to return */
  pCsr->iMinDocid = fts3DocidRange(pDocidGe, SMALLEST_INT64);
  pCsr->iMaxDocid = fts3DocidRange(pDocidLe, LARGEST_INT64);

  if( idxStr ){
    pCsr->bDesc = (idxStr[0]=='D');
  }else{
    pCsr->bDesc = p->bDescIdx;
  }
  pCsr->eSearch = (i16)eSearch;

  if( eSearch!=FTS3_DOCID_SEARCH && eSearch!=FTS3_FULLSCAN_SEARCH ){
    int iCol = eSearch-FTS3_FULLTEXT_SEARCH;
    const char *zQuery = (const char *)sqlite3_value_text(pCons);

    if( zQuery==0 && sqlite3_value_type(pCons)!=SQLITE_NULL ){
      return SQLITE_NOMEM;
    }

    pCsr->iLangid = 0;
    if( pLangid ) pCsr->iLangid = sqlite3_value_int(pLangid);

    assert( p->base.zErrMsg==0 );
    rc = sqlite3Fts3ExprParse(p->pTokenizer, pCsr->iLangid,
        p->azColumn, p->bFts4, p->nColumn, iCol, zQuery, -1, &pCsr->pExpr, 
        &p->base.zErrMsg
    );
    if( rc!=SQLITE_OK ){
      return rc;
    }

    rc = fts3EvalStart(pCsr);
    sqlite3Fts3SegmentsClose(p);
    if( rc!=SQLITE_OK ) return rc;
    pCsr->pNextId = pCsr->aDoclist;
    pCsr->iPrevId = 0;
  }

  /* Compile a SELECT statement for this cursor. For a full-table-scan, the
  ** statement loops through all rows of the %_content table. For a
  ** full-text query or docid lookup, the statement retrieves a single
  ** row by docid.
  */
  if( eSearch==FTS3_FULLSCAN_SEARCH ){
    if( pDocidGe || pDocidLe ){
      zSql = sqlite3_mprintf(
          "SELECT %s WHERE rowid BETWEEN %lld AND %lld ORDER BY rowid %s",
          p->zReadExprlist, pCsr->iMinDocid, pCsr->iMaxDocid,
          (pCsr->bDesc ? "DESC" : "ASC")
      );
    }else{
      zSql = sqlite3_mprintf("SELECT %s ORDER BY rowid %s", 
          p->zReadExprlist, (pCsr->bDesc ? "DESC" : "ASC")
      );
    }
    if( zSql ){
      rc = sqlite3_prepare_v3(p->db,zSql,-1,SQLITE_PREPARE_PERSISTENT,&pCsr->pStmt,0);
      sqlite3_free(zSql);
    }else{
      rc = SQLITE_NOMEM;
    }
  }else if( eSearch==FTS3_DOCID_SEARCH ){
    rc = fts3CursorSeekStmt(pCsr);
    if( rc==SQLITE_OK ){
      rc = sqlite3_bind_value(pCsr->pStmt, 1, pCons);
    }
  }
  if( rc!=SQLITE_OK ) return rc;

  return fts3NextMethod(pCursor);
}